

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void ctranspose(double *sig,int rows,int cols,double *col)

{
  double *pdVar1;
  int r;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (rows < 0x40 && cols < 0x40) {
    if (0 < rows) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        if (0 < cols) {
          uVar4 = 0;
          pdVar1 = col;
          do {
            *pdVar1 = sig[uVar2 + uVar4];
            uVar4 = uVar4 + 1;
            pdVar1 = pdVar1 + (uint)rows;
          } while ((uint)cols != uVar4);
        }
        uVar3 = uVar3 + 1;
        col = col + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + cols);
      } while (uVar3 != (uint)rows);
    }
    return;
  }
  rtranspose(sig,rows,cols,col,rows,cols);
  return;
}

Assistant:

void ctranspose(double *sig, int rows, int cols,double *col) {
	int r,c;
	int block;

	block = (int) BLOCKSIZE;
	r= rows;
	c = cols;
	if (rows >= block || cols >= block)  {
		rtranspose(sig,rows,cols,col,r,c);
	} else {
		stranspose(sig,rows,cols,col);
	}
}